

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

int64_t read_int(MIR_context_t ctx,char *err_msg)

{
  char cVar1;
  long *plVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int64_t iVar6;
  int64_t extraout_RAX;
  void *pvVar7;
  long lVar8;
  char *pcVar9;
  MIR_label_t *ppMVar10;
  gen_ctx *pgVar11;
  int64_t extraout_RAX_00;
  long extraout_RDX;
  FILE *__size;
  FILE *pFVar12;
  MIR_context_t ctx_00;
  MIR_context_t ctx_01;
  ulong uVar13;
  size_t __size_00;
  long lVar14;
  MIR_context_t pMVar15;
  ulong uVar16;
  VARR_MIR_label_t *pVVar17;
  
  uVar4 = get_byte(ctx);
  pMVar15 = (MIR_context_t)(ulong)uVar4;
  if (0xfffffff7 < uVar4 - 0x11) {
    if ((int)uVar4 < 9) {
      uVar16 = 0;
    }
    else {
      uVar13 = 0;
      uVar16 = 0;
      do {
        iVar5 = get_byte(ctx);
        uVar16 = uVar16 | (long)iVar5 << (uVar13 & 0x3f);
        uVar13 = uVar13 + 8;
      } while ((ulong)(uVar4 - 8) << 3 != uVar13);
    }
    return uVar16;
  }
  pFVar12 = (FILE *)&DAT_00000002;
  iVar6 = (*ctx->error_func)(MIR_binary_io_error,err_msg);
  if ((pFVar12 != (FILE *)0x0) && (pFVar12->_IO_read_end != (char *)0x0)) {
    *(undefined8 *)pFVar12 = 0;
    return iVar6;
  }
  VARR_uint8_ttrunc_cold_1();
  lVar8 = extraout_RAX;
  if (extraout_RDX != 0) {
    lVar14 = 0;
    do {
      plVar2 = (long *)pFVar12->_IO_buf_base;
      ctx_00 = (MIR_context_t)plVar2[2];
      if (ctx_00 == (MIR_context_t)0x0) {
        push_data_cold_1();
        if (ctx_00 != (MIR_context_t)0x0) {
          return (int64_t)ctx_00->gen_ctx;
        }
        VARR_uint8_tlength_cold_1();
        if (ctx_00 != (MIR_context_t)0x0) {
          return (int64_t)ctx_00->error_func;
        }
        VARR_uint8_taddr_cold_1();
        pVVar17 = ctx_00->io_ctx->func_labels;
        __size = (FILE *)err_msg;
        ctx_01 = ctx_00;
        if (pVVar17 != (VARR_MIR_label_t *)0x0) goto LAB_0013eb8f;
        goto LAB_0013ebf1;
      }
      cVar1 = *(char *)((long)&((FILE *)err_msg)->_flags + lVar14);
      pMVar15 = (MIR_context_t)CONCAT71((int7)((ulong)pMVar15 >> 8),cVar1);
      uVar16 = *plVar2 + 1;
      if ((ulong)plVar2[1] < uVar16) {
        __size_00 = (uVar16 >> 1) + uVar16;
        pvVar7 = realloc(ctx_00,__size_00);
        plVar2[2] = (long)pvVar7;
        plVar2[1] = __size_00;
      }
      lVar8 = *plVar2;
      *plVar2 = lVar8 + 1;
      *(char *)(plVar2[2] + lVar8) = cVar1;
      lVar14 = lVar14 + 1;
    } while (extraout_RDX != lVar14);
  }
  return lVar8;
  while( true ) {
    if (ctx_01 == (MIR_context_t)0x0) {
      to_lab_cold_1();
      goto LAB_0013ec42;
    }
    pcVar9 = (char *)((long)&((FILE *)pVVar17->els_num)->_flags + 1);
    if ((char *)pVVar17->size < pcVar9) {
      __size = (FILE *)((long)(pcVar9 + ((ulong)pcVar9 >> 1)) * 8);
      ppMVar10 = (MIR_label_t *)realloc(ctx_01,(size_t)__size);
      pVVar17->varr = ppMVar10;
      pVVar17->size = (size_t)(pcVar9 + ((ulong)pcVar9 >> 1));
    }
    sVar3 = pVVar17->els_num;
    pVVar17->els_num = sVar3 + 1;
    pVVar17->varr[sVar3] = (MIR_label_t)0x0;
    pVVar17 = ctx_00->io_ctx->func_labels;
    pFVar12 = (FILE *)err_msg;
    pMVar15 = ctx_00;
    if (pVVar17 == (VARR_MIR_label_t *)0x0) break;
LAB_0013eb8f:
    ctx_01 = (MIR_context_t)pVVar17->varr;
    if (err_msg < (FILE *)pVVar17->els_num) goto LAB_0013ebf6;
  }
LAB_0013ebf1:
  ctx_00 = pMVar15;
  err_msg = (char *)pFVar12;
  to_lab_cold_4();
LAB_0013ebf6:
  if (ctx_01 == (MIR_context_t)0x0) {
LAB_0013ec47:
    to_lab_cold_3();
    ctx_01->io_ctx->io_file = __size;
    MIR_read_with_func(ctx_01,file_reader);
    return extraout_RAX_00;
  }
  pgVar11 = (&ctx_01->gen_ctx)[(long)err_msg];
  if (pgVar11 == (gen_ctx *)0x0) {
    __size = (FILE *)err_msg;
    ctx_01 = ctx_00;
    pgVar11 = (gen_ctx *)create_label(ctx_00,(int64_t)err_msg);
    pVVar17 = ctx_00->io_ctx->func_labels;
    if (((pVVar17 == (VARR_MIR_label_t *)0x0) || (pVVar17->varr == (MIR_label_t *)0x0)) ||
       ((FILE *)pVVar17->els_num <= err_msg)) {
LAB_0013ec42:
      to_lab_cold_2();
      goto LAB_0013ec47;
    }
    pVVar17->varr[(long)err_msg] = (MIR_label_t)pgVar11;
  }
  return (int64_t)pgVar11;
}

Assistant:

static int64_t read_int (MIR_context_t ctx, const char *err_msg) {
  int c = get_byte (ctx);

  if (TAG_I1 > c || c > TAG_I8) MIR_get_error_func (ctx) (MIR_binary_io_error, err_msg);
  return get_int (ctx, c - TAG_I1 + 1);
}